

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void CMpoll_forever(CManager_conflict cm)

{
  CMControlList cl;
  pthread_t pVar1;
  FILE *pFVar2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  bool bVar6;
  timespec ts;
  
  cl = cm->control_list;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                   ,0xab);
  if (cm->control_list->select_initialized == 0) {
    CM_init_select(cm->control_list,cm);
  }
  if (cl->has_thread < 1) {
    bVar6 = true;
  }
  else {
    pVar1 = cl->server_thread;
    pVar5 = pthread_self();
    bVar6 = pVar1 != pVar5;
  }
  while (cl->closed == 0) {
    iVar3 = CMtrace_val[3];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,CMLowLevelVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)cm->CMTrace_file;
        _Var4 = getpid();
        pVar5 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      pFVar2 = (FILE *)cm->CMTrace_file;
      pVar5 = pthread_self();
      fprintf(pFVar2,"CM Poll Forever - thread %zx doing wait\n",pVar5);
    }
    fflush((FILE *)cm->CMTrace_file);
    CMcontrol_list_wait(cl);
  }
  iVar3 = CMtrace_val[3];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(cm,CMLowLevelVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)cm->CMTrace_file;
      _Var4 = getpid();
      pVar5 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fwrite("CM Poll Forever - doing close\n",0x1e,1,(FILE *)cm->CMTrace_file);
  }
  fflush((FILE *)cm->CMTrace_file);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0xc5);
  CManager_close(cm);
  if (!bVar6) {
    pthread_exit((void *)0x0);
  }
  return;
}

Assistant:

static void
CMpoll_forever(CManager cm)
{
    CMControlList cl = cm->control_list;
    int should_exit = 0;
    CManager_lock(cm);
    if (!cm->control_list->select_initialized) {
	CM_init_select(cm->control_list, cm);
    }
    if (cl->has_thread > 0 && cl->server_thread == thr_thread_self()) {
	/* 
	 * if we're actually the server thread here, do a thread exit when
	 * we're done
	 */
	should_exit++;
    }
    while(!cl->closed) {
	CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Forever - thread %zx doing wait\n", (size_t)thr_thread_self());
	if (CMcontrol_list_wait(cl) == -1) {
	    CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Forever - doing close and exit\n");
	    /* 
	     * error.  others will free the CM too, add to the ref count 
	     * here so we can close.
	     */
	    cm->reference_count++;
	    CManager_unlock(cm);
	    CManager_close(cm);
	    exit(1);
	}
    }
    CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Forever - doing close\n");
    CManager_unlock(cm);
    CManager_close(cm);
    if (should_exit != 0) thr_thread_exit(NULL);
}